

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int libssh2_session_handshake(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  char *__src;
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  time_t tVar4;
  ssize_t sVar5;
  uchar *puVar6;
  char *pcVar7;
  size_t sVar8;
  ulong __n;
  size_t *psVar9;
  char local_79;
  size_t *local_78;
  time_t local_70;
  libssh2_socket_t local_64;
  key_exchange_state_t *local_60;
  uchar *local_58;
  uchar *local_50;
  packet_require_state_t *local_48;
  uchar **local_40;
  uchar *local_38;
  
  local_64 = sock;
  tVar4 = time((time_t *)0x0);
  __src = session->banner_TxRx_banner;
  local_60 = &session->startup_key_state;
  local_38 = session->startup_service;
  local_50 = session->startup_service + 1;
  local_58 = session->startup_service + 5;
  local_40 = &session->startup_data;
  psVar9 = &session->startup_data_len;
  local_48 = &session->startup_req_state;
  local_78 = psVar9;
  local_70 = tVar4;
LAB_00109014:
  switch(session->startup_state) {
  case libssh2_NB_state_idle:
    if (local_64 != -1) {
      session->socket_fd = local_64;
      uVar1 = fcntl(local_64,3,0);
      uVar1 = uVar1 >> 0xb & 1;
      session->socket_prev_blockstate = uVar1 ^ 1;
      if (uVar1 == 0) {
        iVar2 = session->socket_fd;
        uVar1 = fcntl(iVar2,3,0);
        tVar4 = local_70;
        iVar2 = fcntl(iVar2,4,(ulong)(uVar1 | 0x800));
        if (iVar2 != 0) {
          pcVar7 = "Failed changing socket\'s blocking state to non-blocking";
          goto LAB_001094ee;
        }
      }
      session->startup_state = libssh2_NB_state_created;
      goto switchD_00109030_caseD_2;
    }
    iVar2 = -0x2d;
    pcVar7 = "Bad socket provided";
    goto LAB_001094ee;
  default:
    return -0x22;
  case libssh2_NB_state_created:
switchD_00109030_caseD_2:
    sVar8 = 0x18;
    pcVar7 = "SSH-2.0-libssh2_1.11.0\r\n";
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      pcVar7 = (char *)(session->local).banner;
      if ((uchar *)pcVar7 == (uchar *)0x0) {
        pcVar7 = "SSH-2.0-libssh2_1.11.0\r\n";
      }
      else {
        sVar8 = strlen(pcVar7);
      }
      session->banner_TxRx_state = libssh2_NB_state_created;
    }
    *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfd;
    sVar5 = (*session->send)(session->socket_fd,(uchar *)pcVar7 + session->banner_TxRx_total_send,
                             sVar8 - session->banner_TxRx_total_send,
                             (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
    if (0 < sVar5) {
      session->total_bytes_sent = session->total_bytes_sent + sVar5;
    }
    tVar4 = local_70;
    if (sVar5 == sVar8 - session->banner_TxRx_total_send) {
      session->banner_TxRx_total_send = 0;
      session->startup_state = libssh2_NB_state_sent;
      session->banner_TxRx_state = libssh2_NB_state_idle;
switchD_00109030_caseD_3:
      if (session->banner_TxRx_state == libssh2_NB_state_idle) {
        session->banner_TxRx_state = libssh2_NB_state_created;
        __n = 0;
      }
      else {
        __n = session->banner_TxRx_total_send;
        if (0xff < __n) goto LAB_00109232;
      }
      do {
        if ((__n != 0) && (__src[__n - 1] == '\n')) break;
        local_79 = '\0';
        *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfe;
        sVar5 = (*session->recv)(session->socket_fd,&local_79,1,
                                 (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
        if (sVar5 < 1) {
          if (sVar5 < 0) {
            if (sVar5 == -0xb) {
              session->socket_block_directions = 1;
              session->banner_TxRx_total_send = __n;
              iVar2 = -0x25;
            }
            else {
              session->banner_TxRx_state = libssh2_NB_state_idle;
              session->banner_TxRx_total_send = 0;
              iVar2 = -0x2b;
            }
          }
          else {
            session->socket_state = -1;
            iVar2 = -0xd;
          }
          goto LAB_0010932f;
        }
        session->total_bytes_received = session->total_bytes_received + sVar5;
        if ((__n == 0) && (local_79 == '\r' || local_79 == '\n')) {
          __n = 0;
        }
        else {
          if (local_79 == '\0') {
            session->banner_TxRx_state = libssh2_NB_state_idle;
            session->banner_TxRx_total_send = 0;
            iVar2 = -2;
            goto LAB_0010932f;
          }
          __src[__n] = local_79;
          __n = __n + 1;
        }
      } while (__n < 0x100);
LAB_00109232:
      do {
        if ((session->banner_TxRx_banner[__n - 1] != '\r') &&
           (session->banner_TxRx_banner[__n - 1] != '\n')) goto LAB_0010924f;
        __n = __n - 1;
        if (__n == 0) {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          session->banner_TxRx_total_send = 0;
          iVar2 = -2;
          goto LAB_00109454;
        }
      } while( true );
    }
    psVar9 = local_78;
    if (sVar5 < 0 && sVar5 != -0xb) {
      session->banner_TxRx_state = libssh2_NB_state_idle;
      session->banner_TxRx_total_send = 0;
      iVar2 = -0x2b;
      pcVar7 = "Failed sending banner";
      goto LAB_001094ee;
    }
    session->socket_block_directions = 2;
    if (0 < sVar5) {
      session->banner_TxRx_total_send = session->banner_TxRx_total_send + sVar5;
    }
    break;
  case libssh2_NB_state_sent:
    goto switchD_00109030_caseD_3;
  case libssh2_NB_state_sent1:
    goto switchD_00109030_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00109030_caseD_5;
  case libssh2_NB_state_sent3:
    goto switchD_00109030_caseD_6;
  case libssh2_NB_state_sent4:
    goto switchD_00109030_caseD_7;
  }
  goto LAB_001094fc;
LAB_0010924f:
  session->banner_TxRx_state = libssh2_NB_state_idle;
  session->banner_TxRx_total_send = 0;
  puVar6 = (session->remote).banner;
  if (puVar6 != (uchar *)0x0) {
    (*session->free)(puVar6,&session->abstract);
  }
  puVar6 = (uchar *)(*session->alloc)(__n + 1,&session->abstract);
  (session->remote).banner = puVar6;
  if (puVar6 == (uchar *)0x0) {
    iVar2 = _libssh2_error(session,-6,"Error allocating space for remote banner");
LAB_0010932f:
    if (iVar2 != 0) {
      psVar9 = local_78;
      if (iVar2 == -0x25) goto LAB_001094fc;
LAB_00109454:
      pcVar7 = "Failed getting banner";
      psVar9 = local_78;
      goto LAB_001094ee;
    }
  }
  else {
    memcpy(puVar6,__src,__n);
    (session->remote).banner[__n] = '\0';
  }
  psVar9 = local_78;
  iVar2 = strncmp("SSH-",(char *)(session->remote).banner,4);
  if (iVar2 == 0) goto code_r0x0010935c;
  goto switchD_00109030_caseD_3;
code_r0x0010935c:
  session->startup_state = libssh2_NB_state_sent1;
switchD_00109030_caseD_4:
  iVar2 = _libssh2_kex_exchange(session,0,local_60);
  if (iVar2 == -0x25) goto LAB_001094fc;
  if (iVar2 != 0) {
    pcVar7 = "Unable to exchange encryption keys";
    goto LAB_001094ee;
  }
  session->startup_state = libssh2_NB_state_sent2;
switchD_00109030_caseD_5:
  session->startup_service[0] = '\x05';
  _libssh2_htonu32(local_50,0xc);
  builtin_memcpy(local_58,"ssh-userauth",0xc);
  session->startup_state = libssh2_NB_state_sent3;
switchD_00109030_caseD_6:
  iVar2 = _libssh2_transport_send(session,local_38,0x11,(uchar *)0x0,0);
  if (iVar2 == -0x25) goto LAB_001094fc;
  if (iVar2 == 0) {
    session->startup_state = libssh2_NB_state_sent4;
switchD_00109030_caseD_7:
    iVar2 = _libssh2_packet_require(session,'\x06',local_40,psVar9,0,(uchar *)0x0,0,local_48);
    if (iVar2 != 0) {
      pcVar7 = "Failed to get response to ssh-userauth request";
      goto LAB_001094ee;
    }
    if (*psVar9 < 5) {
      iVar2 = -0xe;
      pcVar7 = "Unexpected packet length";
      goto LAB_001094ee;
    }
    uVar3 = _libssh2_ntohu32(session->startup_data + 1);
    session->startup_service_length = (ulong)uVar3;
    puVar6 = session->startup_data;
    if ((uVar3 == 0xc) && (iVar2 = strncmp("ssh-userauth",(char *)(puVar6 + 5),0xc), iVar2 == 0)) {
      (*session->free)(puVar6,&session->abstract);
      session->startup_data = (uchar *)0x0;
      session->startup_state = libssh2_NB_state_idle;
      return 0;
    }
    (*session->free)(puVar6,&session->abstract);
    session->startup_data = (uchar *)0x0;
    iVar2 = _libssh2_error(session,-0xe,"Invalid response received from server");
    tVar4 = local_70;
  }
  else {
    pcVar7 = "Unable to ask for ssh-userauth service";
LAB_001094ee:
    iVar2 = _libssh2_error(session,iVar2,pcVar7);
  }
  if (iVar2 != -0x25) {
    return iVar2;
  }
LAB_001094fc:
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar2 = _libssh2_wait_socket(session,tVar4);
  if (iVar2 != 0) {
    return iVar2;
  }
  goto LAB_00109014;
}

Assistant:

LIBSSH2_API int
libssh2_session_handshake(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    BLOCK_ADJUST(rc, session, session_startup(session, sock));

    return rc;
}